

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void charFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  uint uVar2;
  byte *z_00;
  byte *pbVar3;
  sqlite3_int64 sStack_40;
  uint c;
  sqlite3_int64 x;
  byte *pbStack_30;
  int i;
  uchar *zOut;
  uchar *z;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  z_00 = (byte *)sqlite3_malloc(argc << 2);
  if (z_00 == (byte *)0x0) {
    sqlite3_result_error_nomem(context);
  }
  else {
    pbStack_30 = z_00;
    for (x._4_4_ = 0; x._4_4_ < argc; x._4_4_ = x._4_4_ + 1) {
      sStack_40 = sqlite3_value_int64(argv[x._4_4_]);
      if ((sStack_40 < 0) || (0x10ffff < sStack_40)) {
        sStack_40 = 0xfffd;
      }
      uVar2 = (uint)sStack_40 & 0x1fffff;
      bVar1 = (byte)uVar2;
      if (uVar2 < 0x80) {
        *pbStack_30 = bVar1;
        pbStack_30 = pbStack_30 + 1;
      }
      else if (uVar2 < 0x800) {
        pbVar3 = pbStack_30 + 1;
        *pbStack_30 = ((byte)(uVar2 >> 6) & 0x1f) - 0x40;
        pbStack_30 = pbStack_30 + 2;
        *pbVar3 = (bVar1 & 0x3f) + 0x80;
      }
      else if (uVar2 < 0x10000) {
        *pbStack_30 = ((byte)(uVar2 >> 0xc) & 0xf) - 0x20;
        pbVar3 = pbStack_30 + 2;
        pbStack_30[1] = ((byte)(uVar2 >> 6) & 0x3f) + 0x80;
        pbStack_30 = pbStack_30 + 3;
        *pbVar3 = (bVar1 & 0x3f) + 0x80;
      }
      else {
        *pbStack_30 = (char)(uVar2 >> 0x12) - 0x10;
        pbStack_30[1] = ((byte)(uVar2 >> 0xc) & 0x3f) + 0x80;
        pbVar3 = pbStack_30 + 3;
        pbStack_30[2] = ((byte)(uVar2 >> 6) & 0x3f) + 0x80;
        pbStack_30 = pbStack_30 + 4;
        *pbVar3 = (bVar1 & 0x3f) + 0x80;
      }
    }
    sqlite3_result_text(context,(char *)z_00,(int)pbStack_30 - (int)z_00,sqlite3_free);
  }
  return;
}

Assistant:

static void charFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  unsigned char *z, *zOut;
  int i;
  zOut = z = sqlite3_malloc( argc*4 );
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  for(i=0; i<argc; i++){
    sqlite3_int64 x;
    unsigned c;
    x = sqlite3_value_int64(argv[i]);
    if( x<0 || x>0x10ffff ) x = 0xfffd;
    c = (unsigned)(x & 0x1fffff);
    if( c<0x00080 ){
      *zOut++ = (u8)(c&0xFF);
    }else if( c<0x00800 ){
      *zOut++ = 0xC0 + (u8)((c>>6)&0x1F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else if( c<0x10000 ){
      *zOut++ = 0xE0 + (u8)((c>>12)&0x0F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else{
      *zOut++ = 0xF0 + (u8)((c>>18) & 0x07);
      *zOut++ = 0x80 + (u8)((c>>12) & 0x3F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }                                                    \
  }
  sqlite3_result_text(context, (char*)z, (int)(zOut-z), sqlite3_free);
}